

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O2

future<void> __thiscall
ThreadPool::
enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long)>>
          (ThreadPool *this,
          _Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long)>
          *f)

{
  runtime_error *this_00;
  _Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long)>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  future<void> fVar1;
  shared_ptr<std::packaged_task<void_()>_> task;
  __shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2> local_68;
  unique_lock<std::mutex> lock;
  
  std::
  _Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long)>
  ::_Bind((_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long)>
           *)&lock,in_RDX);
  std::
  make_shared<std::packaged_task<void()>,std::_Bind<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long)>()>>
            ((_Bind<std::_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long)>_()>
              *)&task);
  std::packaged_task<void_()>::get_future((packaged_task<void_()> *)this);
  std::unique_lock<std::mutex>::unique_lock(&lock,(mutex_type *)&f[2]._M_bound_args);
  if (*(char *)&f[5]._M_bound_args.
                super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long>
                .super__Head_base<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_false>.
                _M_head_impl != '\x01') {
    std::__shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,
               &task.super___shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>);
    std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<ThreadPool::enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long)>>(std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long)>&&)::_lambda()_1_>
              ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
               &(f->_M_bound_args).
                super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long>
                .
                super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long>
                .super__Tuple_impl<2UL,_float_*,_unsigned_long,_unsigned_long>.
                super__Head_base<2UL,_float_*,_false>,(anon_class_16_1_8991e283 *)&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    std::condition_variable::notify_one();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&task.super___shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    fVar1.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    fVar1.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (future<void>)
           fVar1.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"enqueue on stopped ThreadPool");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto ThreadPool::enqueue(F&& f, Args&&... args)
    -> std::future<typename std::result_of<F(Args...)>::type> {
  using return_type = typename std::result_of<F(Args...)>::type;
  auto task = std::make_shared< std::packaged_task<return_type()> >(
    std::bind(std::forward<F>(f), std::forward<Args>(args)...)
  );
  std::future<return_type> res = task->get_future();
  {
    std::unique_lock<std::mutex> lock(queue_mutex);
    // don't allow enqueueing after stopping the pool
    if (stop) {
      throw std::runtime_error("enqueue on stopped ThreadPool");
    }
    tasks.emplace([task](){ (*task)(); });
  }
  condition.notify_one();
  return res;
}